

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O0

void __thiscall
glslang::TLiveTraverser::addFunctionCall(TLiveTraverser *this,TIntermAggregate *call)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_true>
  local_28;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_true>
  local_20;
  TIntermAggregate *local_18;
  TIntermAggregate *call_local;
  TLiveTraverser *this_local;
  
  local_18 = call;
  call_local = (TIntermAggregate *)this;
  iVar2 = (*(call->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x35])();
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
       ::find(&this->liveFunctions,(key_type *)CONCAT44(extraout_var,iVar2));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
       ::end(&this->liveFunctions);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    iVar2 = (*(local_18->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x35])();
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ::insert(&this->liveFunctions,(value_type *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*(local_18->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x35])();
    pushFunction(this,(TString *)CONCAT44(extraout_var_01,iVar2));
  }
  return;
}

Assistant:

void addFunctionCall(TIntermAggregate* call)
    {
        // just use the map to ensure we process each function at most once
        if (liveFunctions.find(call->getName()) == liveFunctions.end()) {
            liveFunctions.insert(call->getName());
            pushFunction(call->getName());
        }
    }